

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

BOOL __thiscall
Memory::Recycler::TryFinishConcurrentCollect<(Memory::CollectionFlags)268439552>(Recycler *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  DWORD DVar5;
  DWORD DVar6;
  undefined4 *puVar7;
  ConfigFlagsTable *pCVar8;
  uint tickCount;
  BOOL forceInThread;
  BOOL concurrent;
  Recycler *this_local;
  
  BVar4 = CollectionInProgress(this);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x122b,"(this->CollectionInProgress())","this->CollectionInProgress()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  (this->collectionStats).finishCollectTryCount = (this->collectionStats).finishCollectTryCount + 1;
  SetupPostCollectionFlags<(Memory::CollectionFlags)268439552>(this);
  BVar4 = IsConcurrentEnabled(this);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1233,"(this->IsConcurrentEnabled())","this->IsConcurrentEnabled()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  BVar4 = IsConcurrentState(this);
  if ((BVar4 == 0) && (bVar3 = IsCollectionDisabled(this), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1234,"(IsConcurrentState() || IsCollectionDisabled())",
                       "IsConcurrentState() || IsCollectionDisabled()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((this->concurrentThread == (HANDLE)0x0) ||
     (BVar4 = IsConcurrentExecutingState(this), BVar4 == 0)) {
    BVar4 = FinishConcurrentCollectWrapped(this,CollectConcurrentStress);
    return BVar4;
  }
  if ((this->priorityBoost & 1U) == 0) {
    DVar5 = GetTickCount();
    if ((this->autoHeap).uncollectedAllocBytes <=
        RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost) {
      uVar1 = this->tickCountStartConcurrent;
      pCVar8 = GetRecyclerFlagsTable(this);
      DVar6 = RecyclerHeuristic::PriorityBoostTimeout(pCVar8);
      if (DVar5 - uVar1 <= DVar6) goto LAB_009c0dc3;
    }
    pCVar8 = GetRecyclerFlagsTable(this);
    bVar3 = Js::Phases::IsEnabled(&pCVar8->Trace,RecyclerPhase);
    if (bVar3) {
      Output::Print(L"%04X> RC(%p): %s: ",this->mainThreadId,this,L"Set priority normal");
      if (RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost <
          (this->autoHeap).uncollectedAllocBytes) {
        Output::Print(L"AllocBytes=%d (Time=%d)\n",(this->autoHeap).uncollectedAllocBytes,
                      (ulong)(DVar5 - this->tickCountStartConcurrent));
      }
      else {
        Output::Print(L"Time=%d (AllocBytes=%d\n",(ulong)(DVar5 - this->tickCountStartConcurrent),
                      (this->autoHeap).uncollectedAllocBytes);
      }
    }
    this->priorityBoost = true;
    SetThreadPriority(this->concurrentThread,0);
  }
LAB_009c0dc3:
  bVar3 = FinishDisposeObjectsWrapped<(Memory::CollectionFlags)268439552>(this);
  return (uint)bVar3;
}

Assistant:

BOOL
Recycler::TryFinishConcurrentCollect()
{
    Assert(this->CollectionInProgress());

    RECYCLER_STATS_INC(this, finishCollectTryCount);

    SetupPostCollectionFlags<flags>();
    const BOOL concurrent = flags & CollectMode_Concurrent;
    const BOOL forceInThread = flags & CollectOverride_ForceInThread;

    Assert(this->IsConcurrentEnabled());
    Assert(IsConcurrentState() || IsCollectionDisabled());
    Assert(!concurrent || !forceInThread);
    if (concurrent && concurrentThread != NULL)
    {
        if (IsConcurrentExecutingState())
        {
            if (!this->priorityBoost)
            {
                uint tickCount = GetTickCount();
                if ((autoHeap.uncollectedAllocBytes > RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost)
                    || (tickCount - this->tickCountStartConcurrent > RecyclerHeuristic::PriorityBoostTimeout(this->GetRecyclerFlagsTable())))
                {

    #ifdef RECYCLER_TRACE
                    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::RecyclerPhase))
                    {
                        Output::Print(_u("%04X> RC(%p): %s: "), this->mainThreadId, this, _u("Set priority normal"));
                        if (autoHeap.uncollectedAllocBytes > RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost)
                        {
                            Output::Print(_u("AllocBytes=%d (Time=%d)\n"), autoHeap.uncollectedAllocBytes, tickCount - this->tickCountStartConcurrent);
                        }
                        else
                        {
                            Output::Print(_u("Time=%d (AllocBytes=%d\n"), tickCount - this->tickCountStartConcurrent, autoHeap.uncollectedAllocBytes);
                        }
                    }
    #endif
                    // Set it to a large number so we don't set the thread priority again
                    this->priorityBoost = true;

                    // The recycler thread hasn't come back in 5 seconds
                    // It either has a large object graph, or it is starving.
                    // Set the priority back to normal
                    SetThreadPriority(this->concurrentThread, THREAD_PRIORITY_NORMAL);
                }
            }

            return FinishDisposeObjectsWrapped<flags>();
        }
        else if ((flags & CollectOverride_FinishConcurrentTimeout) != 0)
        {
            uint tickCount = GetTickCount();

            // If we haven't gone past the time to call finish collection,
            // simply call FinishDisposeObjects and return
            // Otherwise, actually go ahead and call FinishConcurrentCollectWrapped
            // We do this only if this is a collection that allows finish concurrent to timeout
            // If not, by default, we finish the collection
            if (tickCount <= this->tickCountNextFinishCollection)
            {
                return FinishDisposeObjectsWrapped<flags>();
            }
        }
    }

    return FinishConcurrentCollectWrapped(flags);
}